

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void expandFormatArguments<String,char>
               (vector<String,_std::allocator<String>_> *data,String *arg,char *rest)

{
  pointer pcVar1;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pcVar1 = (arg->_string)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (arg->_string)._M_string_length);
  std::vector<String,_std::allocator<String>_>::push_back(data,(value_type *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  expandFormatArguments<char>(data,rest);
  return;
}

Assistant:

void expandFormatArguments (std::vector<String>& data, const T& arg, const RestTypes& ... rest)
{
	data.push_back (FormatArgument (arg).text());
	expandFormatArguments (data, rest...);
}